

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_SetLineBlocking(FParser *this)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  FLineIdIterator itr;
  
  bVar2 = CheckArgs(this,2);
  if (bVar2) {
    uVar3 = intvalue(this->t_argv + 1);
    if (uVar3 < 3) {
      uVar1 = SF_SetLineBlocking::blocks[uVar3];
      itr.searchtag = intvalue(this->t_argv);
      itr.start = tagManager.IDHashFirst[itr.searchtag & 0xff];
      while( true ) {
        uVar3 = FLineIdIterator::Next(&itr);
        if ((int)uVar3 < 0) break;
        lines[uVar3].flags = lines[uVar3].flags & 0xffff7ffe | (uint)uVar1;
      }
    }
  }
  return;
}

Assistant:

void FParser::SF_SetLineBlocking(void)
{
	static unsigned short blocks[]={0,ML_BLOCKING,ML_BLOCKEVERYTHING};
	
	if (CheckArgs(2))
	{
		int blocking=intvalue(t_argv[1]);
		if (blocking>=0 && blocking<=2) 
		{
			blocking=blocks[blocking];
			int tag=intvalue(t_argv[0]);
			FLineIdIterator itr(tag);
			int i;
			while ((i = itr.Next()) >= 0)
			{
				lines[i].flags = (lines[i].flags & ~(ML_BLOCKING | ML_BLOCKEVERYTHING)) | blocking;
			}
		}
	}
}